

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.c
# Opt level: O2

void virtual_mem_main(rx_context *rx__context,void *rx__data)

{
  w_status wVar1;
  size_t sVar2;
  rx__op in_ECX;
  rx__op rVar3;
  char *in_R8;
  char *pcVar4;
  int iVar5;
  char *in_R9;
  char *pcVar6;
  char *pcVar7;
  char *expr2;
  void *pvVar8;
  rx_severity in_stack_ffffffffffffff98;
  rx_severity rVar9;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  w_vmem mem;
  char *in_stack_ffffffffffffffb0;
  alloc_info info;
  
  wVar1 = w_vmem_create(&mem,(void *)0x0,0xa00000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0xd2,in_ECX,in_R8,in_R9,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffffa0,(rx_severity)mem.addr,in_stack_ffffffffffffffb0);
  iVar5 = (int)in_R9;
  pvVar8 = (void *)CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr);
  pcVar7 = (char *)((long)pvVar8 + 0xa00000);
  get_alloc_info(&info,pvVar8,pcVar7);
  rx__assess_value(rx__context,(uint)(info.addr == pvVar8),0x1079df,(char *)0xd8,in_R8,iVar5,
                   in_stack_ffffffffffffff98,
                   (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar9 = 0xd9;
  pcVar6 = "0xA00000";
  rx__uint_assess_comparison
            (rx__context,info.size,0xa00000,RX__OP_EQUAL,"info.size","0xA00000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0xd9),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,in_stack_ffffffffffffffb0);
  rx__bool_assess_value
            (rx__context,(uint)(info.committed != 0),0,"info.committed",(char *)0xda,(int)pcVar6,
             rVar9,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar3 = 0x107a19;
  pcVar4 = (char *)0xdb;
  rx__bool_assess_value
            (rx__context,(uint)(info.shared != 0),0,"info.shared",(char *)0xdb,(int)pcVar6,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar8 = (void *)CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr);
  wVar1 = w_vmem_commit(&mem,pvVar8,0x200000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0xe0,rVar3,pcVar4,pcVar6,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,rVar9),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,in_stack_ffffffffffffffb0);
  iVar5 = (int)pcVar6;
  sVar2 = w_get_commit_granularity();
  touch_pages(pvVar8,0x200000,sVar2);
  pvVar8 = (void *)CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr);
  pcVar6 = pcVar7;
  get_alloc_info(&info,pvVar8,pcVar7);
  rx__assess_value(rx__context,(uint)(info.addr == pvVar8),0x1079df,(char *)0xe5,pcVar4,iVar5,rVar9,
                   (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar9 = 0xe6;
  iVar5 = 0x107a25;
  rx__uint_assess_comparison
            (rx__context,info.size,0x200000,RX__OP_EQUAL,"info.size","0x200000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0xe6),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,pcVar6);
  rx__bool_assess_value
            (rx__context,(uint)(info.committed != 0),1,"info.committed",(char *)0xe7,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar4 = (char *)0xe8;
  rx__bool_assess_value
            (rx__context,(uint)(info.shared != 0),0,"info.shared",(char *)0xe8,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar8 = (void *)(CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr) + 0x200000);
  get_alloc_info(&info,pvVar8,pcVar7);
  rx__assess_value(rx__context,(uint)(info.addr == pvVar8),0x1079df,(char *)0xec,pcVar4,iVar5,rVar9,
                   (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar9 = 0xed;
  pcVar7 = "0x800000";
  rx__uint_assess_comparison
            (rx__context,info.size,0x800000,RX__OP_EQUAL,"info.size","0x800000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0xed),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,pcVar6);
  rx__bool_assess_value
            (rx__context,(uint)(info.committed != 0),0,"info.committed",(char *)0xee,(int)pcVar7,
             rVar9,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar3 = 0x107a19;
  pcVar4 = (char *)0xef;
  rx__bool_assess_value
            (rx__context,(uint)(info.shared != 0),0,"info.shared",(char *)0xef,(int)pcVar7,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar8 = (void *)(CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr) + 0x900000);
  wVar1 = w_vmem_commit(&mem,pvVar8,0x100000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0xf4,rVar3,pcVar4,pcVar7,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,rVar9),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,pcVar6);
  iVar5 = (int)pcVar7;
  sVar2 = w_get_commit_granularity();
  touch_pages(pvVar8,0x100000,sVar2);
  pvVar8 = (void *)CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr);
  pcVar7 = pcVar6;
  get_alloc_info(&info,pvVar8,pcVar6);
  rx__assess_value(rx__context,(uint)(info.addr == pvVar8),0x1079df,(char *)0xf9,pcVar4,iVar5,rVar9,
                   (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar9 = 0xfa;
  iVar5 = 0x107a25;
  rx__uint_assess_comparison
            (rx__context,info.size,0x200000,RX__OP_EQUAL,"info.size","0x200000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0xfa),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,pcVar7);
  rx__bool_assess_value
            (rx__context,(uint)(info.committed != 0),1,"info.committed",(char *)0xfb,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar4 = (char *)0xfc;
  rx__bool_assess_value
            (rx__context,(uint)(info.shared != 0),0,"info.shared",(char *)0xfc,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar8 = (void *)(CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr) + 0x200000);
  get_alloc_info(&info,pvVar8,pcVar6);
  rx__assess_value(rx__context,(uint)(info.addr == pvVar8),0x1079df,(char *)0x100,pcVar4,iVar5,rVar9
                   ,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar9 = 0x101;
  iVar5 = 0x107a37;
  rx__uint_assess_comparison
            (rx__context,info.size,0x700000,RX__OP_EQUAL,"info.size","0x700000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x101),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,pcVar7);
  rx__bool_assess_value
            (rx__context,(uint)(info.committed != 0),0,"info.committed",(char *)0x102,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar4 = (char *)0x103;
  rx__bool_assess_value
            (rx__context,(uint)(info.shared != 0),0,"info.shared",(char *)0x103,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar8 = (void *)(CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr) + 0x900000);
  get_alloc_info(&info,pvVar8,pcVar6);
  rx__assess_value(rx__context,(uint)(info.addr == pvVar8),0x1079df,(char *)0x107,pcVar4,iVar5,rVar9
                   ,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar9 = 0x108;
  pcVar6 = "0x100000";
  rx__uint_assess_comparison
            (rx__context,info.size,0x100000,RX__OP_EQUAL,"info.size","0x100000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x108),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,pcVar7);
  rx__bool_assess_value
            (rx__context,(uint)(info.committed != 0),1,"info.committed",(char *)0x109,(int)pcVar6,
             rVar9,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar3 = 0x107a19;
  pcVar4 = (char *)0x10a;
  rx__bool_assess_value
            (rx__context,(uint)(info.shared != 0),0,"info.shared",(char *)0x10a,(int)pcVar6,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  wVar1 = w_vmem_uncommit(&mem,(void *)CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr),0x200000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0x10f,rVar3,pcVar4,pcVar6,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,rVar9),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,pcVar7);
  iVar5 = (int)pcVar6;
  pvVar8 = (void *)CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr);
  pcVar6 = pcVar7;
  get_alloc_info(&info,pvVar8,pcVar7);
  rx__assess_value(rx__context,(uint)(info.addr == pvVar8),0x1079df,(char *)0x113,pcVar4,iVar5,rVar9
                   ,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar9 = 0x114;
  expr2 = "0x900000";
  rx__uint_assess_comparison
            (rx__context,info.size,0x900000,RX__OP_EQUAL,"info.size","0x900000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x114),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,pcVar6);
  rx__bool_assess_value
            (rx__context,(uint)(info.committed != 0),0,"info.committed",(char *)0x115,(int)expr2,
             rVar9,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar4 = (char *)0x116;
  rx__bool_assess_value
            (rx__context,(uint)(info.shared != 0),0,"info.shared",(char *)0x116,(int)expr2,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar8 = (void *)(CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr) + 0x900000);
  get_alloc_info(&info,pvVar8,pcVar7);
  rx__assess_value(rx__context,(uint)(info.addr == pvVar8),0x1079df,(char *)0x11a,pcVar4,(int)expr2,
                   rVar9,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rx__bool_assess_value
            (rx__context,(uint)(info.committed != 0),1,"info.committed",(char *)0x11b,(int)expr2,
             rVar9,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar3 = 0x107a19;
  pcVar4 = (char *)0x11c;
  rx__bool_assess_value
            (rx__context,(uint)(info.shared != 0),0,"info.shared",(char *)0x11c,(int)expr2,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar8 = (void *)(CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr) + 0x100000);
  wVar1 = w_vmem_commit(&mem,pvVar8,0x700000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0x121,rVar3,pcVar4,expr2,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,rVar9),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,pcVar6);
  iVar5 = (int)expr2;
  sVar2 = w_get_commit_granularity();
  touch_pages(pvVar8,0x700000,sVar2);
  pvVar8 = (void *)CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr);
  get_alloc_info(&info,pvVar8,pcVar7);
  rx__assess_value(rx__context,(uint)(info.addr == pvVar8),0x1079df,(char *)0x126,pcVar4,iVar5,rVar9
                   ,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar9 = 0x127;
  iVar5 = 0x107fe9;
  rx__uint_assess_comparison
            (rx__context,info.size,0x100000,RX__OP_EQUAL,"info.size","0x100000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x127),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,pcVar6);
  rx__bool_assess_value
            (rx__context,(uint)(info.committed != 0),0,"info.committed",(char *)0x128,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar4 = (char *)0x129;
  rx__bool_assess_value
            (rx__context,(uint)(info.shared != 0),0,"info.shared",(char *)0x129,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar8 = (void *)(CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr) + 0x100000);
  get_alloc_info(&info,pvVar8,pcVar7);
  rx__assess_value(rx__context,(uint)(info.addr == pvVar8),0x1079df,(char *)0x12d,pcVar4,iVar5,rVar9
                   ,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar9 = 0x12e;
  iVar5 = 0x107a37;
  rx__uint_assess_comparison
            (rx__context,info.size,0x700000,RX__OP_EQUAL,"info.size","0x700000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x12e),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,pcVar6);
  rx__bool_assess_value
            (rx__context,(uint)(info.committed != 0),1,"info.committed",(char *)0x12f,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar4 = (char *)0x130;
  rx__bool_assess_value
            (rx__context,(uint)(info.shared != 0),0,"info.shared",(char *)0x130,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar8 = (void *)(CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr) + 0x800000);
  get_alloc_info(&info,pvVar8,pcVar7);
  rx__assess_value(rx__context,(uint)(info.addr == pvVar8),0x1079df,(char *)0x134,pcVar4,iVar5,rVar9
                   ,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar9 = 0x135;
  iVar5 = 0x107fe9;
  rx__uint_assess_comparison
            (rx__context,info.size,0x100000,RX__OP_EQUAL,"info.size","0x100000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x135),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,pcVar6);
  rx__bool_assess_value
            (rx__context,(uint)(info.committed != 0),0,"info.committed",(char *)0x136,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar7 = (char *)0x137;
  rx__bool_assess_value
            (rx__context,(uint)(info.shared != 0),0,"info.shared",(char *)0x137,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar8 = (void *)(CONCAT44(mem.addr._4_4_,(rx_severity)mem.addr) + 0x900000);
  get_alloc_info(&info,pvVar8,pcVar6);
  rx__assess_value(rx__context,(uint)(info.addr == pvVar8),0x1079df,(char *)0x13b,pcVar7,iVar5,rVar9
                   ,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar9 = 0x13c;
  iVar5 = 0x107fe9;
  rx__uint_assess_comparison
            (rx__context,info.size,0x100000,RX__OP_EQUAL,"info.size","0x100000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x13c),in_stack_ffffffffffffffa0,
             (rx_severity)mem.addr,pcVar6);
  rx__bool_assess_value
            (rx__context,(uint)(info.committed != 0),1,"info.committed",(char *)0x13d,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rx__bool_assess_value
            (rx__context,(uint)(info.shared != 0),0,"info.shared",(char *)0x13e,iVar5,rVar9,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  w_vmem_destroy(&mem,0xa00000);
  return;
}

Assistant:

int
main(
    int argc,
    const char **argv
)
{
    return rx_main(0, NULL, argc, argv) == RX_SUCCESS ? 0 : 1;
}